

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O2

void __thiscall
slang::driver::SourceLoader::addFilesInternal
          (SourceLoader *this,string_view pattern,path *basePath,bool isLibraryFile,
          SourceLibrary *library,UnitEntry *unit,bool expandEnvVars)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  byte bVar9;
  bool bVar10;
  byte bVar11;
  uint uVar12;
  value_type_pointer path;
  size_t hash;
  ulong uVar13;
  value_type_pointer ppVar14;
  ulong pos0;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 results;
  value_type_pointer __rhs;
  SourceLoader *pSVar18;
  undefined1 auVar19 [16];
  string_view pattern_00;
  error_code ec_00;
  string_view fmt;
  format_args args;
  undefined6 uStack_170;
  bool isLibraryFile_local;
  try_emplace_args_t local_169;
  SourceLoader *local_168;
  value_type_pointer local_160;
  GlobRank rank;
  hash<std::filesystem::__cxx11::path,_void> *local_150;
  vector<slang::driver::SourceLoader::FileEntry,std::allocator<slang::driver::SourceLoader::FileEntry>>
  *local_148;
  SourceLibrary *library_local;
  pointer local_138;
  size_type sStack_130;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  value_type_pointer local_108;
  error_code ec;
  undefined1 local_f0 [40];
  string_view pattern_local;
  SmallVector<std::filesystem::__cxx11::path,_2UL> files;
  
  bVar10 = expandEnvVars;
  pattern_00._M_len = pattern._M_str;
  files.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
       (pointer)files.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
  files.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
  files.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
  ec._M_value = 0;
  isLibraryFile_local = isLibraryFile;
  local_168 = this;
  library_local = library;
  pattern_local._M_len = pattern._M_len;
  pattern_local._M_str = pattern_00._M_len;
  ec._M_cat = (error_category *)std::_V2::system_category();
  results._1_7_ = 0;
  results._0_1_ = bVar10;
  pattern_00._M_str = (char *)0x0;
  rank = svGlob((slang *)basePath,(path *)pattern._M_len,pattern_00,(GlobMode)&files,
                (SmallVector<std::filesystem::__cxx11::path,_2UL> *)results.values_,false,
                (error_code *)CONCAT17(local_169,CONCAT16(isLibraryFile_local,uStack_170)));
  if (ec._M_value == 0) {
    local_148 = (vector<slang::driver::SourceLoader::FileEntry,std::allocator<slang::driver::SourceLoader::FileEntry>>
                 *)&local_168->fileEntries;
    path = (value_type_pointer)
           (((long)(local_168->fileEntries).
                   super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_168->fileEntries).
                  super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x68 +
           files.super_SmallVectorBase<std::filesystem::__cxx11::path>.len);
    std::
    vector<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
    ::reserve((vector<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
               *)local_148,(size_type)path);
    local_108 = (value_type_pointer)
                (files.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ +
                files.super_SmallVectorBase<std::filesystem::__cxx11::path>.len);
    local_150 = (hash<std::filesystem::__cxx11::path,_void> *)&local_168->fileIndex;
    local_128 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                &local_168->errors;
    pSVar18 = local_168;
    for (ppVar14 = (value_type_pointer)
                   files.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_;
        ppVar14 != local_108; ppVar14 = (value_type_pointer)&ppVar14->second) {
      local_138 = (pointer)(((long)(pSVar18->fileEntries).
                                   super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pSVar18->fileEntries).
                                  super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x68);
      local_160 = ppVar14;
      hash = boost::unordered::detail::foa::mulx_mix::
             mix<slang::hash<std::filesystem::__cxx11::path,void>,std::filesystem::__cxx11::path>
                       (local_150,&ppVar14->first);
      pos0 = hash >> ((byte)(pSVar18->fileIndex).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
                            .arrays.groups_size_index & 0x3f);
      lVar15 = (hash & 0xff) * 4;
      uVar6 = (&UNK_0040eb5c)[lVar15];
      uVar7 = (&UNK_0040eb5d)[lVar15];
      uVar8 = (&UNK_0040eb5e)[lVar15];
      bVar9 = (&UNK_0040eb5f)[lVar15];
      uVar17 = (ulong)((uint)hash & 7);
      uVar13 = 0;
      uVar16 = pos0;
      do {
        pgVar2 = (pSVar18->fileIndex).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
                 .arrays.groups_;
        pgVar1 = pgVar2 + uVar16;
        bVar11 = pgVar1->m[0xf].n;
        auVar19[0] = -(pgVar1->m[0].n == uVar6);
        auVar19[1] = -(pgVar1->m[1].n == uVar7);
        auVar19[2] = -(pgVar1->m[2].n == uVar8);
        auVar19[3] = -(pgVar1->m[3].n == bVar9);
        auVar19[4] = -(pgVar1->m[4].n == uVar6);
        auVar19[5] = -(pgVar1->m[5].n == uVar7);
        auVar19[6] = -(pgVar1->m[6].n == uVar8);
        auVar19[7] = -(pgVar1->m[7].n == bVar9);
        auVar19[8] = -(pgVar1->m[8].n == uVar6);
        auVar19[9] = -(pgVar1->m[9].n == uVar7);
        auVar19[10] = -(pgVar1->m[10].n == uVar8);
        auVar19[0xb] = -(pgVar1->m[0xb].n == bVar9);
        auVar19[0xc] = -(pgVar1->m[0xc].n == uVar6);
        auVar19[0xd] = -(pgVar1->m[0xd].n == uVar7);
        auVar19[0xe] = -(pgVar1->m[0xe].n == uVar8);
        auVar19[0xf] = -(bVar11 == bVar9);
        uVar12 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
        if (uVar12 != 0) {
          ppVar3 = (pSVar18->fileIndex).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
                   .arrays.elements_;
          local_120 = uVar17;
          local_118 = uVar16;
          local_110 = uVar13;
          do {
            uVar5 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            __rhs = ppVar3 + uVar16 * 0xf + (ulong)uVar5;
            path = __rhs;
            bVar10 = std::filesystem::__cxx11::operator==(&local_160->first,&__rhs->first);
            ppVar14 = local_160;
            pSVar18 = local_168;
            if (bVar10) {
              lVar15 = __rhs->second * 0x68;
              if (*(long *)(*(long *)local_148 + 0x58 + lVar15) == 0 && unit == (UnitEntry *)0x0) {
                lVar15 = *(long *)local_148 + lVar15;
                *(byte *)(lVar15 + 100) = *(byte *)(lVar15 + 100) & isLibraryFile_local;
                if (library_local != (SourceLibrary *)0x0) {
                  if ((*(long *)(lVar15 + 0x48) == 0) ||
                     ((int)rank < (int)*(GlobRank *)(lVar15 + 0x60))) {
                    *(SourceLibrary **)(lVar15 + 0x48) = library_local;
                    *(GlobRank *)(lVar15 + 0x60) = rank;
                    *(undefined8 *)(lVar15 + 0x50) = 0;
                  }
                  else if (rank == *(GlobRank *)(lVar15 + 0x60)) {
                    *(SourceLibrary **)(lVar15 + 0x50) = library_local;
                  }
                }
              }
              else {
                local_138 = (local_160->first)._M_pathname._M_dataplus._M_p;
                sStack_130 = (local_160->first)._M_pathname._M_string_length;
                fmt.size_ = 0xd;
                fmt.data_ = (char *)0x2c;
                args.field_1.args_ = results.args_;
                args.desc_ = (unsigned_long_long)&local_138;
                ::fmt::v11::vformat_abi_cxx11_
                          ((string *)local_f0,
                           (v11 *)"\'{}\': included in multiple compilation units",fmt,args);
                pSVar18 = local_168;
                path = (value_type_pointer)local_f0;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          (local_128,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f0);
                std::__cxx11::string::~string((string *)local_f0);
              }
              goto LAB_00178668;
            }
            uVar12 = uVar12 - 1 & uVar12;
          } while (uVar12 != 0);
          bVar11 = pgVar2[uVar16].m[0xf].n;
          uVar13 = local_110;
          uVar16 = local_118;
          uVar17 = local_120;
        }
        ppVar14 = local_160;
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[uVar17] & bVar11) == 0) break;
        uVar4 = (pSVar18->fileIndex).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
                .arrays.groups_size_mask;
        lVar15 = uVar16 + uVar13;
        uVar13 = uVar13 + 1;
        uVar16 = lVar15 + 1U & uVar4;
      } while (uVar13 <= uVar4);
      if ((pSVar18->fileIndex).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
          .size_ctrl.size <
          (pSVar18->fileIndex).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::pair<std::filesystem::__cxx11::path_const,unsigned_long>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::filesystem::__cxx11::path_const&,unsigned_long>
                  ((locator *)local_f0,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::pair<std::filesystem::__cxx11::path_const,unsigned_long>>>
                    *)local_150,pos0,hash,&local_169,&local_160->first,(unsigned_long *)&local_138);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::pair<std::filesystem::__cxx11::path_const,unsigned_long>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::filesystem::__cxx11::path_const&,unsigned_long>
                  ((locator *)local_f0,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::pair<std::filesystem::__cxx11::path_const,unsigned_long>>>
                    *)local_150,hash,&local_169,&local_160->first,(unsigned_long *)&local_138);
      }
      results.values_ = (value<fmt::v11::context> *)&rank;
      path = ppVar14;
      std::
      vector<slang::driver::SourceLoader::FileEntry,std::allocator<slang::driver::SourceLoader::FileEntry>>
      ::
      emplace_back<std::filesystem::__cxx11::path,bool&,slang::SourceLibrary_const*&,slang::driver::SourceLoader::UnitEntry_const*&,slang::GlobRank&>
                (local_148,&ppVar14->first,&isLibraryFile_local,&library_local,&unit,
                 (GlobRank *)results.values_);
LAB_00178668:
    }
  }
  else {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              ((path *)local_f0,&pattern_local,auto_format);
    ec_00._4_4_ = 0;
    ec_00._M_value = ec._M_value;
    path = (value_type_pointer)local_f0;
    ec_00._M_cat = ec._M_cat;
    addError(local_168,(path *)path,ec_00);
    std::filesystem::__cxx11::path::~path((path *)local_f0);
  }
  SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
            (&files.super_SmallVectorBase<std::filesystem::__cxx11::path>,(EVP_PKEY_CTX *)path);
  return;
}

Assistant:

void SourceLoader::addFilesInternal(std::string_view pattern, const fs::path& basePath,
                                    bool isLibraryFile, const SourceLibrary* library,
                                    const UnitEntry* unit, bool expandEnvVars) {
    SmallVector<fs::path> files;
    std::error_code ec;
    auto rank = svGlob(basePath, pattern, GlobMode::Files, files, expandEnvVars, ec);
    if (ec) {
        addError(pattern, ec);
        return;
    }

    fileEntries.reserve(fileEntries.size() + files.size());
    for (auto&& path : files) {
        auto [it, inserted] = fileIndex.try_emplace(path, fileEntries.size());
        if (inserted) {
            fileEntries.emplace_back(std::move(path), isLibraryFile, library, unit, rank);
        }
        else {
            // If this file is supposed to be in a separate unit but is already
            // included elsewhere we should error.
            auto& entry = fileEntries[it->second];
            if (unit || entry.unit) {
                errors.emplace_back(
                    fmt::format("'{}': included in multiple compilation units", getU8Str(path)));
                continue;
            }

            // If any of the times we see this is entry is for a non-library file,
            // then it's always a non-library file, hence the &=.
            entry.isLibraryFile &= isLibraryFile;

            if (library) {
                // If there is already a library for this entry and our rank is lower,
                // we overrule it. If it's higher, we ignore. If it's a tie, we remember
                // that fact for now and later we will issue an error if the tie is
                // never resolved.
                if (!entry.library || rank < entry.libraryRank) {
                    entry.library = library;
                    entry.libraryRank = rank;
                    entry.secondLib = nullptr;
                }
                else if (rank == entry.libraryRank) {
                    entry.secondLib = library;
                }
            }
        }
    }
}